

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_pad(CFL_CTX *cfl,int width,int height)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  int i_1;
  uint16_t *last_row_q3;
  int j_1;
  uint16_t *recon_buf_q3_1;
  int i;
  uint16_t last_pixel;
  int j;
  uint16_t *recon_buf_q3;
  int min_height;
  int diff_height;
  int diff_width;
  int height_local;
  int width_local;
  CFL_CTX *cfl_local;
  
  iVar2 = width - cfl->buf_width;
  iVar3 = height - cfl->buf_height;
  if (0 < iVar2) {
    recon_buf_q3 = cfl->recon_buf_q3 + (width - iVar2);
    for (j = 0; j < height - iVar3; j = j + 1) {
      uVar1 = recon_buf_q3[-1];
      for (i = 0; i < iVar2; i = i + 1) {
        recon_buf_q3[i] = uVar1;
      }
      recon_buf_q3 = recon_buf_q3 + 0x20;
    }
    cfl->buf_width = width;
  }
  if (0 < iVar3) {
    recon_buf_q3_1 = cfl->recon_buf_q3 + (height - iVar3) * 0x20;
    for (j_1 = 0; j_1 < iVar3; j_1 = j_1 + 1) {
      for (i_1 = 0; i_1 < width; i_1 = i_1 + 1) {
        recon_buf_q3_1[i_1] = recon_buf_q3_1[(long)i_1 + -0x20];
      }
      recon_buf_q3_1 = recon_buf_q3_1 + 0x20;
    }
    cfl->buf_height = height;
  }
  return;
}

Assistant:

static inline void cfl_pad(CFL_CTX *cfl, int width, int height) {
  const int diff_width = width - cfl->buf_width;
  const int diff_height = height - cfl->buf_height;

  if (diff_width > 0) {
    const int min_height = height - diff_height;
    uint16_t *recon_buf_q3 = cfl->recon_buf_q3 + (width - diff_width);
    for (int j = 0; j < min_height; j++) {
      const uint16_t last_pixel = recon_buf_q3[-1];
      assert(recon_buf_q3 + diff_width <= cfl->recon_buf_q3 + CFL_BUF_SQUARE);
      for (int i = 0; i < diff_width; i++) {
        recon_buf_q3[i] = last_pixel;
      }
      recon_buf_q3 += CFL_BUF_LINE;
    }
    cfl->buf_width = width;
  }
  if (diff_height > 0) {
    uint16_t *recon_buf_q3 =
        cfl->recon_buf_q3 + ((height - diff_height) * CFL_BUF_LINE);
    for (int j = 0; j < diff_height; j++) {
      const uint16_t *last_row_q3 = recon_buf_q3 - CFL_BUF_LINE;
      assert(recon_buf_q3 + width <= cfl->recon_buf_q3 + CFL_BUF_SQUARE);
      for (int i = 0; i < width; i++) {
        recon_buf_q3[i] = last_row_q3[i];
      }
      recon_buf_q3 += CFL_BUF_LINE;
    }
    cfl->buf_height = height;
  }
}